

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O0

void trial::protocol::bintoken::
     format<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,std::allocator<char>>
               (basic_variable<std::allocator<char>_> *data,
               basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
               *result)

{
  undefined1 local_78 [8];
  writer writer;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  *result_local;
  basic_variable<std::allocator<char>_> *data_local;
  
  writer.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)result;
  basic_writer<16ul>::
  basic_writer<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
            ((basic_writer<16ul> *)local_78,result);
  partial::format<std::allocator<char>>(data,(writer *)local_78);
  basic_writer<16UL>::~basic_writer((basic_writer<16UL> *)local_78);
  return;
}

Assistant:

void format(const trial::dynamic::basic_variable<Allocator>& data,
            T& result)
{
    bintoken::writer writer(result);
    partial::format(data, writer);
}